

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  float *pfVar6;
  uint *puVar7;
  long lVar8;
  float *pfVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  
  bVar3 = (k->res).ulog2;
  iVar10 = 2 << (bVar3 & 0x1f);
  lVar8 = (long)iVar10 * (long)k->vw;
  if ((int)lVar8 != 0) {
    puVar7 = (uint *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 4);
    puVar1 = (uint *)((long)puVar7 + lVar8 * 2);
    pfVar9 = k->kv;
    iVar4 = k->uw;
    pfVar6 = k->ku;
    do {
      fVar12 = *pfVar6;
      fVar11 = fVar12 * (float)(*puVar7 & 0xffff);
      fVar12 = fVar12 * (float)(*puVar7 >> 0x10);
      if (iVar4 != 1) {
        lVar8 = 0;
        do {
          uVar5 = *(uint *)((long)puVar7 + lVar8 + 4);
          fVar2 = *(float *)((long)pfVar6 + lVar8 + 4);
          fVar11 = fVar11 + fVar2 * (float)(uVar5 & 0xffff);
          fVar12 = fVar12 + fVar2 * (float)(uVar5 >> 0x10);
          lVar8 = lVar8 + 4;
        } while ((long)(iVar4 * 2) * 2 + -4 != lVar8);
        puVar7 = (uint *)((long)puVar7 + lVar8);
      }
      fVar2 = *pfVar9;
      pfVar9 = pfVar9 + 1;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar12 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar11 + (float)*(undefined8 *)result);
      puVar7 = (uint *)((long)puVar7 + (long)(iVar10 + iVar4 * -2) * 2 + 4);
    } while (puVar7 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }